

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O0

void cjson_add_bool_should_add_bool(void)

{
  cJSON *object;
  cJSON *pcVar1;
  cJSON *false_item;
  cJSON *true_item;
  cJSON *root;
  
  object = cJSON_CreateObject();
  cJSON_AddBoolToObject(object,"true",1);
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"true");
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0xa4);
  }
  UnityAssertEqualNumber((long)pcVar1->type,2,(char *)0x0,0xa5,UNITY_DISPLAY_STYLE_INT);
  cJSON_AddBoolToObject(object,"false",0);
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"false");
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0xa9);
  }
  UnityAssertEqualNumber((long)pcVar1->type,1,(char *)0x0,0xaa,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_bool_should_add_bool(void)
{
    cJSON *root = cJSON_CreateObject();
    cJSON *true_item = NULL;
    cJSON *false_item = NULL;

    /* true */
    cJSON_AddBoolToObject(root, "true", true);
    TEST_ASSERT_NOT_NULL(true_item = cJSON_GetObjectItemCaseSensitive(root, "true"));
    TEST_ASSERT_EQUAL_INT(true_item->type, cJSON_True);

    /* false */
    cJSON_AddBoolToObject(root, "false", false);
    TEST_ASSERT_NOT_NULL(false_item = cJSON_GetObjectItemCaseSensitive(root, "false"));
    TEST_ASSERT_EQUAL_INT(false_item->type, cJSON_False);

    cJSON_Delete(root);
}